

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

void ARKodeSPRKTable_Write(ARKodeSPRKTable sprk_table,FILE *outfile)

{
  ARKodeButcherTable *in_RSI;
  ARKodeSPRKTable in_RDI;
  ARKodeButcherTable b;
  ARKodeButcherTable a;
  FILE *in_stack_ffffffffffffffd8;
  ARKodeButcherTable B;
  
  B = (ARKodeButcherTable)0x0;
  ARKodeSPRKTable_ToButcher(in_RDI,in_RSI,(ARKodeButcherTable *)0x0);
  ARKodeButcherTable_Write(B,in_stack_ffffffffffffffd8);
  ARKodeButcherTable_Write(B,in_stack_ffffffffffffffd8);
  ARKodeButcherTable_Free(B);
  ARKodeButcherTable_Free(B);
  return;
}

Assistant:

void ARKodeSPRKTable_Write(ARKodeSPRKTable sprk_table, FILE* outfile)
{
  ARKodeButcherTable a = NULL;
  ARKodeButcherTable b = NULL;

  ARKodeSPRKTable_ToButcher(sprk_table, &a, &b);

  ARKodeButcherTable_Write(a, outfile);
  ARKodeButcherTable_Write(b, outfile);

  ARKodeButcherTable_Free(a);
  ARKodeButcherTable_Free(b);
}